

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu541.c
# Opt level: O3

MPP_RET hal_h265e_v541_start(void *hal,HalEncTask *task)

{
  long lVar1;
  long lVar2;
  MPP_RET MVar3;
  RK_U32 RVar4;
  MPP_RET MVar5;
  char *fmt;
  ulong uVar6;
  MppDevRegRdCfg cfg1;
  MppDevRegWrCfg cfg;
  long local_50 [3];
  undefined8 local_38;
  
  lVar1 = *(long *)((long)hal + 0x70);
  lVar2 = *(long *)((long)hal + 0x80);
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v541","(%d) enter\n",(char *)0x0,0x704);
  }
  if ((task->flags).err != 0) {
    _mpp_log_l(2,"hal_h265e_v541","enc_task->flags.err %08x, return early","hal_h265e_v541_start");
    return MPP_NOK;
  }
  vepu541_h265_set_l2_regs((H265eV541HalContext *)hal,*(H265eV54xL2RegSet **)((long)hal + 0x78));
  local_50[2] = *(undefined8 *)((long)hal + 0x70);
  local_38 = 0x344;
  MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),4,local_50 + 2);
  if (MVar3 == MPP_OK) {
    local_50[1] = 0x1c00000004;
    local_50[0] = lVar2;
    MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),5,local_50);
    if (MVar3 == MPP_OK) {
      local_50[0] = lVar2 + 4;
      local_50[1] = 0x21000000134;
      MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),5,local_50);
      if (MVar3 == MPP_OK) {
        MVar5 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0xf,(void *)0x0);
        MVar3 = MPP_OK;
        if (MVar5 != MPP_OK) {
          _mpp_log_l(2,"hal_h265e_v541","send cmd failed %d\n","hal_h265e_v541_start",
                     (ulong)(uint)MVar5);
          MVar3 = MVar5;
        }
        goto LAB_0024e3ca;
      }
    }
    fmt = "set register read failed %d\n";
  }
  else {
    fmt = "set register write failed %d\n";
  }
  _mpp_log_l(2,"hal_h265e_v541",fmt,"hal_h265e_v541_start",(ulong)(uint)MVar3);
LAB_0024e3ca:
  uVar6 = 0;
  RVar4 = hal_h265e_debug;
  do {
    if ((RVar4 & 0x10) != 0) {
      _mpp_log_l(4,"hal_h265e_v541","set reg[%04d]: 0%08x\n",(char *)0x0,uVar6 & 0xffffffff,
                 (ulong)*(uint *)(lVar1 + uVar6 * 4));
      RVar4 = hal_h265e_debug;
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0xd1);
  if ((RVar4 & 8) != 0) {
    _mpp_log_l(4,"hal_h265e_v541","vpu client is sending %d regs",(char *)0x0,0);
    RVar4 = hal_h265e_debug;
  }
  if ((RVar4 & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v541","(%d) leave\n",(char *)0x0,0x73c);
  }
  return MVar3;
}

Assistant:

MPP_RET hal_h265e_v541_start(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    H265eV541HalContext *ctx = (H265eV541HalContext *)hal;
    RK_U32 length = 0;
    HalEncTask *enc_task = task;
    H265eV541IoctlOutputElem *reg_out = (H265eV541IoctlOutputElem *)ctx->reg_out;
    RK_U32 i;
    RK_U32 *regs = (RK_U32*)ctx->regs;
    hal_h265e_enter();

    if (enc_task->flags.err) {
        hal_h265e_err("enc_task->flags.err %08x, return early",
                      enc_task->flags.err);
        return MPP_NOK;
    }
    vepu541_h265_set_l2_regs(ctx, (H265eV54xL2RegSet*)ctx->l2_regs);

    do {
        MppDevRegWrCfg cfg;

        cfg.reg = ctx->regs;
        cfg.size = sizeof(H265eV541RegSet);
        cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        MppDevRegRdCfg cfg1;

        cfg1.reg = &reg_out->hw_status;
        cfg1.size = sizeof(RK_U32);
        cfg1.offset = VEPU541_REG_BASE_HW_STATUS;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &cfg1);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        cfg1.reg = &reg_out->st_bsl;
        cfg1.size = sizeof(H265eV541IoctlOutputElem) - 4;
        cfg1.offset = VEPU541_REG_BASE_STATISTICS;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &cfg1);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    for (i = 0; i < sizeof(H265eV541RegSet) / 4; i++) {
        hal_h265e_dbg_regs("set reg[%04d]: 0%08x\n", i, regs[i]);
    }

    hal_h265e_dbg_detail("vpu client is sending %d regs", length);
    hal_h265e_leave();
    return ret;
}